

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::write_headers(Stream *strm,Headers *headers)

{
  bool bVar1;
  undefined8 *in_RCX;
  void *__buf;
  Stream *in_RDI;
  ssize_t len;
  ssize_t len_1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *x;
  const_iterator __end2;
  const_iterator __begin2;
  Headers *__range2;
  ssize_t write_len;
  char **in_stack_00000820;
  char **in_stack_00000828;
  char *in_stack_00000830;
  Stream *in_stack_00000838;
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff98;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  undefined8 local_58;
  undefined8 local_50;
  ssize_t local_48;
  reference local_40;
  _Self local_38;
  _Self local_30 [2];
  long local_20;
  Stream *local_10;
  ssize_t local_8;
  
  local_20 = 0;
  local_10 = in_RDI;
  local_30[0]._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_ffffffffffffff98);
  local_38._M_node =
       (_Base_ptr)
       std::
       multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = std::operator!=(local_30,&local_38);
    if (!bVar1) {
      local_8 = Stream::write(local_10,0x2a5040,__buf,(size_t)in_RCX);
      if (-1 < local_8) {
        local_8 = local_8 + local_20;
      }
      return local_8;
    }
    local_40 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator*(in_stack_ffffffffffffffa0);
    local_50 = std::__cxx11::string::c_str();
    local_58 = std::__cxx11::string::c_str();
    in_RCX = &local_58;
    local_48 = Stream::write_format<char_const*,char_const*>
                         (in_stack_00000838,in_stack_00000830,in_stack_00000828,in_stack_00000820);
    if (local_48 < 0) break;
    local_20 = local_48 + local_20;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++(in_stack_ffffffffffffffa0);
  }
  return local_48;
}

Assistant:

inline ssize_t write_headers(Stream &strm, const Headers &headers) {
  ssize_t write_len = 0;
  for (const auto &x : headers) {
    auto len =
        strm.write_format("%s: %s\r\n", x.first.c_str(), x.second.c_str());
    if (len < 0) { return len; }
    write_len += len;
  }
  auto len = strm.write("\r\n");
  if (len < 0) { return len; }
  write_len += len;
  return write_len;
}